

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::NewScObjectNoArg(Var instance,ScriptContext *requestContext)

{
  ImplicitCallFlags IVar1;
  ThreadContext *pTVar2;
  JavascriptLibrary *pJVar3;
  ScriptContext *pSVar4;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  Attributes AVar8;
  BOOL BVar9;
  JavascriptProxy *this;
  RecyclableObject *pRVar10;
  FunctionInfo *functionInfo;
  RecyclableObject *instance_00;
  undefined4 *puVar11;
  JavascriptArray *object;
  JavascriptMethod p_Var12;
  RecyclableObject *ptr;
  JavascriptFunction *pJVar13;
  ConstructorCache *pCVar14;
  DynamicObject *value;
  Var pvVar15;
  Arguments local_58;
  ScriptContext *local_48;
  void *local_40;
  Var dummy;
  
  bVar6 = VarIs<Js::JavascriptProxy>(instance);
  if ((!bVar6) ||
     (this = UnsafeVarTo<Js::JavascriptProxy>(instance), this == (JavascriptProxy *)0x0)) {
    functionInfo = GetConstructorFunctionInfo(instance,requestContext);
    pRVar10 = VarTo<Js::RecyclableObject>(instance);
    if (functionInfo == (FunctionInfo *)JavascriptObject::EntryInfo::NewInstance) {
      if ((JavascriptObject::EntryInfo::NewInstance[0x18] & 1) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x18c1,
                                    "((functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0)"
                                    ,
                                    "(functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0"
                                   );
        if (!bVar6) goto LAB_00ab6f06;
        *puVar11 = 0;
      }
      pJVar3 = (((pRVar10->type).ptr)->javascriptLibrary).ptr;
      object = (JavascriptArray *)JavascriptLibrary::CreateObject(pJVar3,true,0);
      bVar6 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
      if (bVar6) {
        pRVar10 = JavascriptProxy::AutoProxyWrapper(object);
        object = (JavascriptArray *)VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar10);
      }
      if (*(char *)((long)&(object->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                           type.ptr[1].javascriptLibrary.ptr + 1) == '\0') {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x18cf,"(newObjectType->GetIsShared())",
                                    "newObjectType->GetIsShared()");
        if (!bVar6) goto LAB_00ab6f06;
        *puVar11 = 0;
      }
      pJVar13 = VarTo<Js::JavascriptFunction>(instance);
      pCVar14 = JavascriptFunction::GetConstructorCache(pJVar13);
      if ((pCVar14->content).updateAfterCtor == true) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x18d2,
                                    "(!constructor->GetConstructorCache()->NeedsUpdateAfterCtor())",
                                    "!constructor->GetConstructorCache()->NeedsUpdateAfterCtor()");
        if (!bVar6) {
LAB_00ab6f06:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar11 = 0;
      }
      pSVar4 = (pJVar3->super_JavascriptLibraryBase).scriptContext.ptr;
    }
    else {
      if (functionInfo != (FunctionInfo *)JavascriptArray::EntryInfo::NewInstance) {
        local_48 = requestContext;
        if (functionInfo == (FunctionInfo *)0x0) {
          instance_00 = (RecyclableObject *)NewScObjectHostDispatchOrProxy(pRVar10,requestContext);
        }
        else {
          instance_00 = (RecyclableObject *)
                        NewScObjectCommon(pRVar10,functionInfo,requestContext,false);
        }
        pTVar2 = ((((((pRVar10->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                  scriptContext.ptr)->threadContext;
        dummy._6_1_ = pTVar2->reentrancySafeOrHandled;
        pTVar2->reentrancySafeOrHandled = true;
        AVar8 = FunctionInfo::GetAttributes(pRVar10);
        bVar6 = ThreadContext::HasNoSideEffect(pTVar2,pRVar10,AVar8);
        if (bVar6) {
          ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
          if (pTVar2->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var12 = RecyclableObject::GetEntryPoint(pRVar10);
          CheckIsExecutable(pRVar10,p_Var12);
          p_Var12 = RecyclableObject::GetEntryPoint(pRVar10);
          ptr = (RecyclableObject *)
                (*p_Var12)(pRVar10,(CallInfo)pRVar10,
                           "gthSym() || newHeadSegmentLengthSym == baseArrayValueInfo->HeadSegmentLengthSym())"
                           ,0,0,0,0,
                           "gthSym() || newHeadSegmentLengthSym == baseArrayValueInfo->HeadSegmentLengthSym())"
                           ,instance_00);
          bVar6 = ThreadContext::IsOnStack(ptr);
        }
        else {
          if ((pTVar2->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
            pTVar2->implicitCallFlags = pTVar2->implicitCallFlags | ImplicitCall_Accessor;
            ptr = (((((((((pRVar10->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase
                      ).scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
                  super_JavascriptLibraryBase).undefinedValue.ptr;
            goto LAB_00ab6db9;
          }
          if ((AVar8 & HasNoSideEffect) == None) {
            dummy._7_1_ = pTVar2->implicitCallFlags;
            ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
            if (pTVar2->noJsReentrancy == true) {
              Throw::FatalJsReentrancyError();
            }
            p_Var12 = RecyclableObject::GetEntryPoint(pRVar10);
            CheckIsExecutable(pRVar10,p_Var12);
            p_Var12 = RecyclableObject::GetEntryPoint(pRVar10);
            ptr = (RecyclableObject *)
                  (*p_Var12)(pRVar10,(CallInfo)pRVar10,
                             "gthSym() || newHeadSegmentLengthSym == baseArrayValueInfo->HeadSegmentLengthSym())"
                             ,0,0,0,0,
                             "gthSym() || newHeadSegmentLengthSym == baseArrayValueInfo->HeadSegmentLengthSym())"
                             ,instance_00);
            pTVar2->implicitCallFlags = dummy._7_1_ | ImplicitCall_Accessor;
            goto LAB_00ab6db9;
          }
          ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
          if (pTVar2->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var12 = RecyclableObject::GetEntryPoint(pRVar10);
          CheckIsExecutable(pRVar10,p_Var12);
          p_Var12 = RecyclableObject::GetEntryPoint(pRVar10);
          ptr = (RecyclableObject *)
                (*p_Var12)(pRVar10,(CallInfo)pRVar10,
                           "gthSym() || newHeadSegmentLengthSym == baseArrayValueInfo->HeadSegmentLengthSym())"
                           ,0,0,0,0,
                           "gthSym() || newHeadSegmentLengthSym == baseArrayValueInfo->HeadSegmentLengthSym())"
                           ,instance_00);
          bVar6 = ThreadContext::IsOnStack(ptr);
        }
        if (bVar6 != false) {
          pTVar2->implicitCallFlags = pTVar2->implicitCallFlags | ImplicitCall_Accessor;
        }
LAB_00ab6db9:
        pTVar2->reentrancySafeOrHandled = (bool)dummy._6_1_;
        BVar9 = IsObject(ptr);
        if (BVar9 != 0) {
          instance_00 = ptr;
        }
        bVar6 = VarIs<Js::JavascriptFunction>(instance);
        pSVar4 = local_48;
        if ((((bVar6) &&
             (pJVar13 = UnsafeVarTo<Js::JavascriptFunction>(instance),
             pJVar13 != (JavascriptFunction *)0x0)) &&
            (pCVar14 = JavascriptFunction::GetConstructorCache(pJVar13),
            pCVar14 != (ConstructorCache *)0x0)) && ((pCVar14->content).updateAfterCtor == true)) {
          UpdateNewScObjectCache(pRVar10,instance_00,pSVar4);
        }
        bVar6 = ConfigFlagsTable::IsEnabled
                          ((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
        if (!bVar6) {
          return instance_00;
        }
        pRVar10 = JavascriptProxy::AutoProxyWrapper(instance_00);
        value = VarTo<Js::DynamicObject,Js::RecyclableObject>(pRVar10);
        pvVar15 = CrossSite::MarshalVar
                            (pSVar4,value,
                             (((((value->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                             ->super_JavascriptLibraryBase).scriptContext.ptr);
        return pvVar15;
      }
      if ((JavascriptArray::EntryInfo::NewInstance[0x18] & 1) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x18df,
                                    "((functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0)"
                                    ,
                                    "(functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0"
                                   );
        if (!bVar6) goto LAB_00ab6f06;
        *puVar11 = 0;
      }
      pJVar3 = (((pRVar10->type).ptr)->javascriptLibrary).ptr;
      object = JavascriptLibrary::CreateArray(pJVar3);
      bVar6 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
      if (bVar6) {
        object = (JavascriptArray *)JavascriptProxy::AutoProxyWrapper(object);
      }
      if (*(char *)((long)&(object->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                           type.ptr[1].javascriptLibrary.ptr + 1) == '\0') {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x18ed,"(newArrayType->GetIsShared())",
                                    "newArrayType->GetIsShared()");
        if (!bVar6) goto LAB_00ab6f06;
        *puVar11 = 0;
      }
      pJVar13 = VarTo<Js::JavascriptFunction>(instance);
      pCVar14 = JavascriptFunction::GetConstructorCache(pJVar13);
      if ((pCVar14->content).updateAfterCtor == true) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x18f0,
                                    "(!constructor->GetConstructorCache()->NeedsUpdateAfterCtor())",
                                    "!constructor->GetConstructorCache()->NeedsUpdateAfterCtor()");
        if (!bVar6) goto LAB_00ab6f06;
        *puVar11 = 0;
      }
      pSVar4 = (pJVar3->super_JavascriptLibraryBase).scriptContext.ptr;
    }
    if (pSVar4 == requestContext) {
      return object;
    }
    CrossSite::MarshalDynamicObjectAndPrototype(requestContext,(DynamicObject *)object);
    return object;
  }
  local_40 = (void *)0x0;
  pTVar2 = requestContext->threadContext;
  bVar6 = pTVar2->reentrancySafeOrHandled;
  pTVar2->reentrancySafeOrHandled = true;
  AVar8 = FunctionInfo::GetAttributes((RecyclableObject *)this);
  bVar7 = ThreadContext::HasNoSideEffect(pTVar2,(RecyclableObject *)this,AVar8);
  if (bVar7) {
    local_58.Info =
         (Type)((long)
                "(!baseArrayValueInfo->HeadSegmentLengthSym() || newHeadSegmentLengthSym == baseArrayValueInfo->HeadSegmentLengthSym())"
               + 0x24);
    local_58.Values = &local_40;
    pRVar10 = (RecyclableObject *)
              JavascriptProxy::ConstructorTrap
                        (this,&local_58,requestContext,(AuxArray<unsigned_int> *)0x0);
    bVar7 = ThreadContext::IsOnStack(pRVar10);
  }
  else {
    if ((pTVar2->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      pTVar2->implicitCallFlags = pTVar2->implicitCallFlags | ImplicitCall_Accessor;
      pRVar10 = (((((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                      javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                  super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
                undefinedValue.ptr;
      goto LAB_00ab6d8a;
    }
    if ((AVar8 & HasNoSideEffect) == None) {
      IVar1 = pTVar2->implicitCallFlags;
      local_58.Info =
           (Type)((long)
                  "(!baseArrayValueInfo->HeadSegmentLengthSym() || newHeadSegmentLengthSym == baseArrayValueInfo->HeadSegmentLengthSym())"
                 + 0x24);
      local_58.Values = &local_40;
      pRVar10 = (RecyclableObject *)
                JavascriptProxy::ConstructorTrap
                          (this,&local_58,requestContext,(AuxArray<unsigned_int> *)0x0);
      pTVar2->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00ab6d8a;
    }
    local_58.Info =
         (Type)((long)
                "(!baseArrayValueInfo->HeadSegmentLengthSym() || newHeadSegmentLengthSym == baseArrayValueInfo->HeadSegmentLengthSym())"
               + 0x24);
    local_58.Values = &local_40;
    pRVar10 = (RecyclableObject *)
              JavascriptProxy::ConstructorTrap
                        (this,&local_58,requestContext,(AuxArray<unsigned_int> *)0x0);
    bVar7 = ThreadContext::IsOnStack(pRVar10);
  }
  if (bVar7 != false) {
    pTVar2->implicitCallFlags = pTVar2->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00ab6d8a:
  pTVar2->reentrancySafeOrHandled = bVar6;
  return pRVar10;
}

Assistant:

Var JavascriptOperators::NewScObjectNoArg(Var instance, ScriptContext * requestContext)
    {
        JIT_HELPER_REENTRANT_HEADER(NewScObjectNoArg);
        JavascriptProxy * proxy = JavascriptOperators::TryFromVar<JavascriptProxy>(instance);
        if (proxy)
        {
            Var dummy = nullptr;
            Arguments args(CallInfo(CallFlags_New, 1), &dummy);
            return requestContext->GetThreadContext()->ExecuteImplicitCall(proxy, Js::ImplicitCall_Accessor, [=]()->Js::Var
            {
                return proxy->ConstructorTrap(args, requestContext, 0);
            });
        }

        FunctionInfo* functionInfo = JavascriptOperators::GetConstructorFunctionInfo(instance, requestContext);
        RecyclableObject * object = VarTo<RecyclableObject>(instance);

        if (functionInfo == &JavascriptObject::EntryInfo::NewInstance)
        {
            // Fast path for new Object()
            Assert((functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0);
            JavascriptLibrary* library = object->GetLibrary();

            DynamicObject * newObject = library->CreateObject(true);
            JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newObject));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
            {
                newObject = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(newObject));
            }
#endif

#if DBG
            DynamicType* newObjectType = newObject->GetDynamicType();
            Assert(newObjectType->GetIsShared());

            JavascriptFunction* constructor = VarTo<JavascriptFunction>(instance);
            Assert(!constructor->GetConstructorCache()->NeedsUpdateAfterCtor());
#endif

            ScriptContext * scriptContext = library->GetScriptContext();
            if (scriptContext != requestContext)
            {
                CrossSite::MarshalDynamicObjectAndPrototype(requestContext, newObject);
            }

            return newObject;
        }
        else if (functionInfo == &JavascriptArray::EntryInfo::NewInstance)
        {
            Assert((functionInfo->GetAttributes() & FunctionInfo::ErrorOnNew) == 0);
            JavascriptLibrary* library = object->GetLibrary();

            JavascriptArray * newArray = library->CreateArray();
            JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newArray));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
            {
                newArray = static_cast<JavascriptArray*>(JavascriptProxy::AutoProxyWrapper(newArray));
            }
#endif

#if DBG
            DynamicType* newArrayType = newArray->GetDynamicType();
            Assert(newArrayType->GetIsShared());

            JavascriptFunction* constructor = VarTo<JavascriptFunction>(instance);
            Assert(!constructor->GetConstructorCache()->NeedsUpdateAfterCtor());
#endif

            ScriptContext * scriptContext = library->GetScriptContext();
            if (scriptContext != requestContext)
            {
                CrossSite::MarshalDynamicObjectAndPrototype(requestContext, newArray);
            }
            return newArray;
        }

        Var newObject = functionInfo != nullptr ?
            JavascriptOperators::NewScObjectCommon(object, functionInfo, requestContext) :
            JavascriptOperators::NewScObjectHostDispatchOrProxy(object, requestContext);

        ThreadContext * threadContext = object->GetScriptContext()->GetThreadContext();
        Var returnVar = threadContext->ExecuteImplicitCall(object, Js::ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, object, CallInfo(CallFlags_New, 1), newObject);
        });
        if (JavascriptOperators::IsObject(returnVar))
        {
            newObject = returnVar;
        }

        ConstructorCache * constructorCache = nullptr;
        JavascriptFunction *function = JavascriptOperators::TryFromVar<JavascriptFunction>(instance);
        if (function)
        {
            constructorCache = function->GetConstructorCache();
        }

        if (constructorCache != nullptr && constructorCache->NeedsUpdateAfterCtor())
        {
            JavascriptOperators::UpdateNewScObjectCache(object, newObject, requestContext);
        }

#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            DynamicObject* newDynamicObject = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(newObject));
            // this might come from a different scriptcontext.
            newObject = CrossSite::MarshalVar(requestContext, newDynamicObject, newDynamicObject->GetScriptContext());
        }
#endif

        return newObject;
        JIT_HELPER_END(NewScObjectNoArg);
    }